

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_luma_cdef_strength(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  uint *in_RSI;
  long in_RDI;
  AV1_COMMON *cm;
  int *arg;
  undefined8 *local_40;
  aom_codec_err_t local_4;
  
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_40 = (undefined8 *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_40 = *(undefined8 **)(in_RSI + 2);
    *(undefined8 **)(in_RSI + 2) = local_40 + 1;
  }
  if ((void *)*local_40 == (void *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    memcpy((void *)*local_40,(void *)(*(long *)(*(long *)(in_RDI + 0xb50) + 0x160) + 0x41bb8),0x40);
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_luma_cdef_strength(aom_codec_alg_priv_t *ctx,
                                                   va_list args) {
  int *arg = va_arg(args, int *);
  AV1_COMMON const *cm = &ctx->ppi->cpi->common;
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  memcpy(arg, cm->cdef_info.cdef_strengths, CDEF_MAX_STRENGTHS * sizeof(*arg));

  return AOM_CODEC_OK;
}